

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O0

void __thiscall ClipperLib::ClipperBase::DisposeLocalMinimaList(ClipperBase *this)

{
  LocalMinima *pLVar1;
  LocalMinima *tmpLm;
  ClipperBase *this_local;
  
  while (this->m_MinimaList != (LocalMinima *)0x0) {
    pLVar1 = this->m_MinimaList->next;
    if (this->m_MinimaList != (LocalMinima *)0x0) {
      operator_delete(this->m_MinimaList,0x20);
    }
    this->m_MinimaList = pLVar1;
  }
  this->m_CurrentLM = (LocalMinima *)0x0;
  return;
}

Assistant:

void ClipperBase::DisposeLocalMinimaList()
{
  while( m_MinimaList )
  {
    LocalMinima* tmpLm = m_MinimaList->next;
    delete m_MinimaList;
    m_MinimaList = tmpLm;
  }
  m_CurrentLM = 0;
}